

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O2

void __thiscall
CoreML::Specification::MeanSquaredErrorLossLayer::Clear(MeanSquaredErrorLossLayer *this)

{
  string *psVar1;
  
  psVar1 = (this->input_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  psVar1 = (this->target_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  return;
}

Assistant:

inline void ClearToEmptyNoArena(const ::std::string* default_value) {
    if (ptr_ == default_value) {
      // Nothing: already equal to default (which is the empty string).
    } else {
      ptr_->clear();
    }
  }